

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall OpenMesh::PolyConnectivity::collapse(PolyConnectivity *this,HalfedgeHandle _hh)

{
  bool bVar1;
  HalfedgeHandle _heh;
  BaseHandle local_50;
  BaseHandle local_4c;
  BaseHandle local_48;
  BaseHandle local_44;
  BaseHandle local_40;
  BaseHandle local_3c;
  BaseHandle local_38;
  BaseHandle local_34;
  BaseHandle local_30;
  BaseHandle local_2c;
  HalfedgeHandle o1;
  HalfedgeHandle o0;
  HalfedgeHandle h1;
  HalfedgeHandle h0;
  PolyConnectivity *this_local;
  HalfedgeHandle _hh_local;
  
  o0 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_hh);
  local_2c = _hh.super_BaseHandle.idx_;
  local_34.idx_ = (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,_hh);
  o1.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_34.idx_;
  local_30.idx_ =
       (int)ArrayKernel::next_halfedge_handle
                      (&this->super_ArrayKernel,(HalfedgeHandle)local_34.idx_);
  local_38 = _hh.super_BaseHandle.idx_;
  collapse_edge(this,_hh);
  local_44 = o0.super_BaseHandle.idx_;
  local_40.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,o0);
  local_3c.idx_ =
       (int)ArrayKernel::next_halfedge_handle
                      (&this->super_ArrayKernel,(HalfedgeHandle)local_40.idx_);
  bVar1 = BaseHandle::operator==(&local_3c,&o0.super_BaseHandle);
  if (bVar1) {
    local_4c = o0.super_BaseHandle.idx_;
    local_48.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,o0);
    collapse_loop(this,(HalfedgeHandle)local_48.idx_);
  }
  _heh = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_30.idx_);
  local_50.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh);
  bVar1 = BaseHandle::operator==(&local_50,&local_30);
  if (bVar1) {
    collapse_loop(this,(HalfedgeHandle)local_30.idx_);
  }
  return;
}

Assistant:

void PolyConnectivity::collapse(HalfedgeHandle _hh)
{
  HalfedgeHandle h0 = _hh;
  HalfedgeHandle h1 = next_halfedge_handle(h0);
  HalfedgeHandle o0 = opposite_halfedge_handle(h0);
  HalfedgeHandle o1 = next_halfedge_handle(o0);

  // remove edge
  collapse_edge(h0);

  // remove loops
  if (next_halfedge_handle(next_halfedge_handle(h1)) == h1)
    collapse_loop(next_halfedge_handle(h1));
  if (next_halfedge_handle(next_halfedge_handle(o1)) == o1)
    collapse_loop(o1);
}